

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O1

void __thiscall ddd::DaTrie<true,_false,_false>::rebuild(DaTrie<true,_false,_false> *this)

{
  uint uVar1;
  DaTrie<true,_false,_false> new_trie;
  DaTrie<true,_false,_false> local_88;
  
  local_88.node_links_.super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.node_links_.super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.blocks_.super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.node_links_.super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.blocks_.super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.blocks_.super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.tail_.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_88.tail_.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_88.bc_.super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_88.tail_.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_88.bc_.super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_88.bc_.super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_88.head_pos_ = 0xffffffff;
  local_88.bc_emps_ = 0;
  local_88.tail_emps_ = 0;
  uVar1 = ((int)((ulong)((long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3) - this->bc_emps_ &
          0xffffff00) + 0x400;
  std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::reserve(&local_88.bc_,(ulong)uVar1);
  std::vector<char,_std::allocator<char>_>::reserve
            (&local_88.tail_,
             (long)(this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)((this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start + this->tail_emps_));
  std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::reserve
            (&local_88.blocks_,(ulong)(uVar1 >> 8));
  rebuild_(this,&local_88);
  swap(this,&local_88);
  ~DaTrie(&local_88);
  return;
}

Assistant:

void rebuild() {
    assert(!Prefix);

    DaTrie new_trie;

    const auto bc_capa = num_nodes() / 256 * 256 + 1024; // expecting avoidance of reallocation
    new_trie.bc_.reserve(bc_capa);
    new_trie.tail_.reserve(tail_.size() - tail_emps_);
    new_trie.blocks_.reserve(bc_capa / 256);
    if (WithNLM) {
      new_trie.node_links_.reserve(bc_capa);
    }

    rebuild_(new_trie);
    swap(new_trie);
  }